

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_xz.c
# Opt level: O0

int archive_compressor_xz_write(archive_write_filter *f,void *buff,size_t length)

{
  long lVar1;
  undefined4 uVar2;
  private_data_conflict6 *in_RDX;
  archive_write_filter *in_RSI;
  long in_RDI;
  int ret;
  private_data_conflict6 *data;
  int local_4;
  
  lVar1 = *(long *)(in_RDI + 0x40);
  *(long *)(lVar1 + 0x120) = (long)&in_RDX->compression_level + *(long *)(lVar1 + 0x120);
  if (*(int *)(in_RDI + 0x50) == 9) {
    uVar2 = lzma_crc32(in_RSI,in_RDX,*(undefined4 *)(lVar1 + 0x140));
    *(undefined4 *)(lVar1 + 0x140) = uVar2;
  }
  *(archive_write_filter **)(lVar1 + 8) = in_RSI;
  *(private_data_conflict6 **)(lVar1 + 0x10) = in_RDX;
  local_4 = drive_compressor(in_RSI,in_RDX,(int)((ulong)lVar1 >> 0x20));
  if (local_4 == 0) {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
archive_compressor_xz_write(struct archive_write_filter *f,
    const void *buff, size_t length)
{
	struct private_data *data = (struct private_data *)f->data;
	int ret;

	/* Update statistics */
	data->total_in += length;
	if (f->code == ARCHIVE_FILTER_LZIP)
		data->crc32 = lzma_crc32(buff, length, data->crc32);

	/* Compress input data to output buffer */
	data->stream.next_in = buff;
	data->stream.avail_in = length;
	if ((ret = drive_compressor(f, data, 0)) != ARCHIVE_OK)
		return (ret);

	return (ARCHIVE_OK);
}